

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

CURLcode Curl_output_aws_sigv4(Curl_easy *data,_Bool proxy)

{
  connectdata *conn_00;
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  size_t datalen;
  char *pcVar8;
  bool bVar9;
  size_t *canonical_headers_00;
  undefined4 uVar10;
  char *local_560;
  char *local_4d8;
  char *local_488;
  char *local_460;
  char *local_458;
  size_t hdrlen;
  char *hostreg;
  char *reg;
  char *hostdot;
  char *auth_headers;
  uchar sign1 [32];
  uchar sign0 [32];
  char *secret;
  char *user;
  char *str_to_sign;
  char *credential_scope;
  char *request_type;
  char *canonical_request;
  char content_sha256_hdr [151];
  char local_318 [8];
  char sha_hex [65];
  uchar local_2c8 [8];
  uchar sha_hash [32];
  size_t local_2a0;
  size_t payload_hash_len;
  char *payload_hash;
  char *method;
  char *pcStack_280;
  Curl_HttpReq httpreq;
  char *date_header;
  dynbuf canonical_path;
  dynbuf canonical_query;
  dynbuf signed_headers;
  dynbuf canonical_headers;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char date [9];
  char timestamp [17];
  undefined1 local_1c8 [8];
  tm tm;
  time_t clock;
  char *hostname;
  uchar local_178 [7];
  _Bool sign_as_s3;
  char service [65];
  uchar local_128 [8];
  char region [65];
  char local_d8 [8];
  char provider1 [65];
  char local_88 [8];
  char provider0 [65];
  char *arg;
  size_t len;
  connectdata *conn;
  CURLcode result;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  memset(local_88,0,0x41);
  memset(local_d8,0,0x41);
  memset(local_128,0,0x41);
  memset(local_178,0,0x41);
  pcVar8 = (conn_00->host).name;
  pcStack_280 = (char *)0x0;
  payload_hash = (char *)0x0;
  payload_hash_len = 0;
  local_2a0 = 0;
  memset(&canonical_request,0,0x97);
  request_type = (char *)0x0;
  credential_scope = (char *)0x0;
  str_to_sign = (char *)0x0;
  user = (char *)0x0;
  if ((data->state).aptr.user == (char *)0x0) {
    local_458 = "";
  }
  else {
    local_458 = (data->state).aptr.user;
  }
  sign0[0x18] = '\0';
  sign0[0x19] = '\0';
  sign0[0x1a] = '\0';
  sign0[0x1b] = '\0';
  sign0[0x1c] = '\0';
  sign0[0x1d] = '\0';
  sign0[0x1e] = '\0';
  sign0[0x1f] = '\0';
  memset(sign1 + 0x18,0,0x20);
  memset(&auth_headers,0,0x20);
  pcVar3 = Curl_checkheaders(data,"Authorization",0xd);
  if (pcVar3 != (char *)0x0) {
    return CURLE_OK;
  }
  Curl_dyn_init((dynbuf *)&signed_headers.toobig,0x19000);
  Curl_dyn_init((dynbuf *)&canonical_path.toobig,0x19000);
  Curl_dyn_init((dynbuf *)&canonical_query.toobig,0x19000);
  Curl_dyn_init((dynbuf *)&date_header,0x19000);
  if ((data->set).str[0x44] == (char *)0x0) {
    local_460 = "aws:amz";
  }
  else {
    local_460 = (data->set).str[0x44];
  }
  __isoc99_sscanf(local_460,"%64[^:]:%64[^:]:%64[^:]:%64s",local_88,local_d8,local_128,local_178);
  if (local_88[0] == '\0') {
    Curl_failf(data,"first aws-sigv4 provider cannot be empty");
    conn._0_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    goto LAB_001559f7;
  }
  if (local_d8[0] == '\0') {
    strcpy(local_d8,local_88);
  }
  if (local_178[0] == '\0') {
    pcVar3 = strchr(pcVar8,0x2e);
    if (pcVar3 == (char *)0x0) {
      Curl_failf(data,"aws-sigv4: service missing in parameters and hostname");
      conn._0_4_ = CURLE_URL_MALFORMAT;
      goto LAB_001559f7;
    }
    uVar4 = (long)pcVar3 - (long)pcVar8;
    if (0x40 < uVar4) {
      Curl_failf(data,"aws-sigv4: service too long in hostname");
      conn._0_4_ = CURLE_URL_MALFORMAT;
      goto LAB_001559f7;
    }
    memcpy(local_178,pcVar8,uVar4);
    local_178[uVar4] = '\0';
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"aws_sigv4: picked service %s from host",local_178);
    }
    if (local_128[0] == '\0') {
      pcVar3 = pcVar3 + 1;
      pcVar5 = strchr(pcVar3,0x2e);
      if (pcVar5 == (char *)0x0) {
        Curl_failf(data,"aws-sigv4: region missing in parameters and hostname");
        conn._0_4_ = CURLE_URL_MALFORMAT;
        goto LAB_001559f7;
      }
      uVar4 = (long)pcVar5 - (long)pcVar3;
      if (0x40 < uVar4) {
        Curl_failf(data,"aws-sigv4: region too long in hostname");
        conn._0_4_ = CURLE_URL_MALFORMAT;
        goto LAB_001559f7;
      }
      memcpy(local_128,pcVar3,uVar4);
      local_128[uVar4] = '\0';
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"aws_sigv4: picked region %s from host",local_128);
      }
    }
  }
  Curl_http_method(data,conn_00,&payload_hash,(Curl_HttpReq *)((long)&method + 4));
  iVar1 = curl_strequal(local_88,"aws");
  bVar9 = false;
  if (iVar1 != 0) {
    iVar1 = curl_strequal((char *)local_178,"s3");
    bVar9 = iVar1 != 0;
  }
  payload_hash_len = (size_t)parse_content_sha_hdr(data,local_d8,&local_2a0);
  if ((char *)payload_hash_len == (char *)0x0) {
    if (bVar9) {
      conn._0_4_ = calc_s3_payload_hash
                             (data,method._4_4_,local_d8,local_2c8,local_318,
                              (char *)&canonical_request);
    }
    else {
      conn._0_4_ = calc_payload_hash(data,local_2c8,local_318);
    }
    if ((CURLcode)conn != CURLE_OK) goto LAB_001559f7;
    payload_hash_len = (size_t)local_318;
    local_2a0 = strlen(local_318);
  }
  tm.tm_zone = (char *)time((time_t *)0x0);
  conn._0_4_ = Curl_gmtime((time_t)tm.tm_zone,(tm *)local_1c8);
  if ((CURLcode)conn == CURLE_OK) {
    sVar6 = strftime(date + 1,0x11,"%Y%m%dT%H%M%SZ",(tm *)local_1c8);
    if (sVar6 == 0) {
      conn._0_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      canonical_headers_00 = &signed_headers.toobig;
      conn._0_4_ = make_headers(data,pcVar8,date + 1,local_d8,&stack0xfffffffffffffd80,
                                (char *)&canonical_request,(dynbuf *)canonical_headers_00,
                                (dynbuf *)&canonical_query.toobig);
      uVar10 = (undefined4)((ulong)canonical_headers_00 >> 0x20);
      if ((CURLcode)conn == CURLE_OK) {
        if ((char)canonical_request != '\0') {
          sVar6 = strlen((char *)&canonical_request);
          (content_sha256_hdr + (sVar6 - 8))[0] = '\r';
          (content_sha256_hdr + (sVar6 - 8))[1] = '\n';
          content_sha256_hdr[sVar6 - 6] = '\0';
        }
        canonical_headers.toobig._7_1_ = date[1];
        cStack_1f0 = date[2];
        cStack_1ef = date[3];
        cStack_1ee = date[4];
        cStack_1ed = date[5];
        cStack_1ec = date[6];
        cStack_1eb = date[7];
        cStack_1ea = date[8];
        date[0] = '\0';
        conn._0_4_ = canon_query(data,(data->state).up.query,(dynbuf *)&canonical_path.toobig);
        if ((CURLcode)conn == CURLE_OK) {
          pcVar8 = (data->state).up.path;
          sVar6 = strlen((data->state).up.path);
          conn._0_4_ = canon_string(pcVar8,sVar6,(dynbuf *)&date_header,(_Bool *)0x0);
          pcVar8 = payload_hash;
          if ((CURLcode)conn == CURLE_OK) {
            conn._0_4_ = CURLE_OUT_OF_MEMORY;
            pcVar3 = Curl_dyn_ptr((dynbuf *)&date_header);
            pcVar5 = Curl_dyn_ptr((dynbuf *)&canonical_path.toobig);
            if (pcVar5 == (char *)0x0) {
              local_488 = "";
            }
            else {
              local_488 = Curl_dyn_ptr((dynbuf *)&canonical_path.toobig);
            }
            pcVar5 = Curl_dyn_ptr((dynbuf *)&signed_headers.toobig);
            pcVar7 = Curl_dyn_ptr((dynbuf *)&canonical_query.toobig);
            request_type = curl_maprintf("%s\n%s\n%s\n%s\n%s\n%.*s",pcVar8,pcVar3,local_488,pcVar5,
                                         pcVar7,CONCAT44(uVar10,(int)local_2a0),payload_hash_len);
            if ((uchar *)request_type != (uchar *)0x0) {
              sVar6 = strlen(local_88);
              Curl_strntolower(local_88,local_88,sVar6);
              credential_scope = curl_maprintf("%s4_request",local_88);
              if (((uchar *)credential_scope != (uchar *)0x0) &&
                 (str_to_sign = curl_maprintf("%s/%s/%s/%s",
                                              (undefined1 *)((long)&canonical_headers.toobig + 7),
                                              local_128,local_178,credential_scope),
                 str_to_sign != (char *)0x0)) {
                sVar6 = strlen(request_type);
                CVar2 = Curl_sha256it(local_2c8,(uchar *)request_type,sVar6);
                if (CVar2 == CURLE_OK) {
                  sha256_to_hex(local_318,local_2c8);
                  sVar6 = strlen(local_88);
                  Curl_strntoupper(local_88,local_88,sVar6);
                  user = curl_maprintf("%s4-HMAC-SHA256\n%s\n%s\n%s",local_88,date + 1,str_to_sign,
                                       local_318);
                  if ((uchar *)user != (uchar *)0x0) {
                    if ((data->state).aptr.passwd == (char *)0x0) {
                      local_4d8 = "";
                    }
                    else {
                      local_4d8 = (data->state).aptr.passwd;
                    }
                    sign0._24_8_ = curl_maprintf("%s4%s",local_88,local_4d8);
                    if ((uchar *)sign0._24_8_ != (uchar *)0x0) {
                      sVar6 = strlen((char *)sign0._24_8_);
                      datalen = strlen((char *)((long)&canonical_headers.toobig + 7));
                      conn._0_4_ = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)sign0._24_8_,sVar6,
                                               (uchar *)((long)&canonical_headers.toobig + 7),
                                               datalen,sign1 + 0x18);
                      if ((CURLcode)conn == CURLE_OK) {
                        sVar6 = strlen((char *)local_128);
                        conn._0_4_ = Curl_hmacit(Curl_HMAC_SHA256,sign1 + 0x18,0x20,local_128,sVar6,
                                                 (uchar *)&auth_headers);
                        if ((CURLcode)conn == CURLE_OK) {
                          sVar6 = strlen((char *)local_178);
                          conn._0_4_ = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&auth_headers,0x20,
                                                   local_178,sVar6,sign1 + 0x18);
                          if ((CURLcode)conn == CURLE_OK) {
                            sVar6 = strlen(credential_scope);
                            conn._0_4_ = Curl_hmacit(Curl_HMAC_SHA256,sign1 + 0x18,0x20,
                                                     (uchar *)credential_scope,sVar6,
                                                     (uchar *)&auth_headers);
                            if ((CURLcode)conn == CURLE_OK) {
                              sVar6 = strlen(user);
                              conn._0_4_ = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&auth_headers,0x20,
                                                       (uchar *)user,sVar6,sign1 + 0x18);
                              if ((CURLcode)conn == CURLE_OK) {
                                sha256_to_hex(local_318,sign1 + 0x18);
                                pcVar8 = Curl_dyn_ptr((dynbuf *)&canonical_query.toobig);
                                if (pcStack_280 == (char *)0x0) {
                                  local_560 = "";
                                }
                                else {
                                  local_560 = pcStack_280;
                                }
                                pcVar8 = curl_maprintf(
                                                  "Authorization: %s4-HMAC-SHA256 Credential=%s/%s, SignedHeaders=%s, Signature=%s\r\n%s%s"
                                                  ,local_88,local_458,str_to_sign,pcVar8,local_318,
                                                  local_560,&canonical_request);
                                if (pcVar8 != (char *)0x0) {
                                  (*Curl_cfree)((data->state).aptr.userpwd);
                                  (data->state).aptr.userpwd = (char *)0x0;
                                  (data->state).aptr.userpwd = pcVar8;
                                  (data->state).authhost.field_0x18 =
                                       (data->state).authhost.field_0x18 & 0xfe | 1;
                                  conn._0_4_ = CURLE_OK;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001559f7:
  Curl_dyn_free((dynbuf *)&canonical_path.toobig);
  Curl_dyn_free((dynbuf *)&date_header);
  Curl_dyn_free((dynbuf *)&signed_headers.toobig);
  Curl_dyn_free((dynbuf *)&canonical_query.toobig);
  (*Curl_cfree)(request_type);
  (*Curl_cfree)(credential_scope);
  (*Curl_cfree)(str_to_sign);
  (*Curl_cfree)(user);
  (*Curl_cfree)((void *)sign0._24_8_);
  (*Curl_cfree)(pcStack_280);
  return (CURLcode)conn;
}

Assistant:

CURLcode Curl_output_aws_sigv4(struct Curl_easy *data, bool proxy)
{
  CURLcode result = CURLE_OUT_OF_MEMORY;
  struct connectdata *conn = data->conn;
  size_t len;
  const char *arg;
  char provider0[MAX_SIGV4_LEN + 1]="";
  char provider1[MAX_SIGV4_LEN + 1]="";
  char region[MAX_SIGV4_LEN + 1]="";
  char service[MAX_SIGV4_LEN + 1]="";
  bool sign_as_s3 = FALSE;
  const char *hostname = conn->host.name;
  time_t clock;
  struct tm tm;
  char timestamp[TIMESTAMP_SIZE];
  char date[9];
  struct dynbuf canonical_headers;
  struct dynbuf signed_headers;
  struct dynbuf canonical_query;
  struct dynbuf canonical_path;
  char *date_header = NULL;
  Curl_HttpReq httpreq;
  const char *method = NULL;
  char *payload_hash = NULL;
  size_t payload_hash_len = 0;
  unsigned char sha_hash[CURL_SHA256_DIGEST_LENGTH];
  char sha_hex[SHA256_HEX_LENGTH];
  char content_sha256_hdr[CONTENT_SHA256_HDR_LEN + 2] = ""; /* add \r\n */
  char *canonical_request = NULL;
  char *request_type = NULL;
  char *credential_scope = NULL;
  char *str_to_sign = NULL;
  const char *user = data->state.aptr.user ? data->state.aptr.user : "";
  char *secret = NULL;
  unsigned char sign0[CURL_SHA256_DIGEST_LENGTH] = {0};
  unsigned char sign1[CURL_SHA256_DIGEST_LENGTH] = {0};
  char *auth_headers = NULL;

  DEBUGASSERT(!proxy);
  (void)proxy;

  if(Curl_checkheaders(data, STRCONST("Authorization"))) {
    /* Authorization already present, Bailing out */
    return CURLE_OK;
  }

  /* we init those buffers here, so goto fail will free initialized dynbuf */
  Curl_dyn_init(&canonical_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&canonical_query, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&signed_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&canonical_path, CURL_MAX_HTTP_HEADER);

  /*
   * Parameters parsing
   * Google and Outscale use the same OSC or GOOG,
   * but Amazon uses AWS and AMZ for header arguments.
   * AWS is the default because most of non-amazon providers
   * are still using aws:amz as a prefix.
   */
  arg = data->set.str[STRING_AWS_SIGV4] ?
    data->set.str[STRING_AWS_SIGV4] : "aws:amz";

  /* provider1[:provider2[:region[:service]]]

     No string can be longer than N bytes of non-whitespace
  */
  (void)sscanf(arg, "%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "s",
               provider0, provider1, region, service);
  if(!provider0[0]) {
    failf(data, "first aws-sigv4 provider cannot be empty");
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto fail;
  }
  else if(!provider1[0])
    strcpy(provider1, provider0);

  if(!service[0]) {
    char *hostdot = strchr(hostname, '.');
    if(!hostdot) {
      failf(data, "aws-sigv4: service missing in parameters and hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    len = hostdot - hostname;
    if(len > MAX_SIGV4_LEN) {
      failf(data, "aws-sigv4: service too long in hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    memcpy(service, hostname, len);
    service[len] = '\0';

    infof(data, "aws_sigv4: picked service %s from host", service);

    if(!region[0]) {
      const char *reg = hostdot + 1;
      const char *hostreg = strchr(reg, '.');
      if(!hostreg) {
        failf(data, "aws-sigv4: region missing in parameters and hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      len = hostreg - reg;
      if(len > MAX_SIGV4_LEN) {
        failf(data, "aws-sigv4: region too long in hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      memcpy(region, reg, len);
      region[len] = '\0';
      infof(data, "aws_sigv4: picked region %s from host", region);
    }
  }

  Curl_http_method(data, conn, &method, &httpreq);

  /* AWS S3 requires a x-amz-content-sha256 header, and supports special
   * values like UNSIGNED-PAYLOAD */
  sign_as_s3 = (strcasecompare(provider0, "aws") &&
                strcasecompare(service, "s3"));

  payload_hash = parse_content_sha_hdr(data, provider1, &payload_hash_len);

  if(!payload_hash) {
    if(sign_as_s3)
      result = calc_s3_payload_hash(data, httpreq, provider1, sha_hash,
                                    sha_hex, content_sha256_hdr);
    else
      result = calc_payload_hash(data, sha_hash, sha_hex);
    if(result)
      goto fail;

    payload_hash = sha_hex;
    /* may be shorter than SHA256_HEX_LENGTH, like S3_UNSIGNED_PAYLOAD */
    payload_hash_len = strlen(sha_hex);
  }

#ifdef DEBUGBUILD
  {
    char *force_timestamp = getenv("CURL_FORCETIME");
    if(force_timestamp)
      clock = 0;
    else
      clock = time(NULL);
  }
#else
  clock = time(NULL);
#endif
  result = Curl_gmtime(clock, &tm);
  if(result) {
    goto fail;
  }
  if(!strftime(timestamp, sizeof(timestamp), "%Y%m%dT%H%M%SZ", &tm)) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = make_headers(data, hostname, timestamp, provider1,
                        &date_header, content_sha256_hdr,
                        &canonical_headers, &signed_headers);
  if(result)
    goto fail;

  if(*content_sha256_hdr) {
    /* make_headers() needed this without the \r\n for canonicalization */
    size_t hdrlen = strlen(content_sha256_hdr);
    DEBUGASSERT(hdrlen + 3 < sizeof(content_sha256_hdr));
    memcpy(content_sha256_hdr + hdrlen, "\r\n", 3);
  }

  memcpy(date, timestamp, sizeof(date));
  date[sizeof(date) - 1] = 0;

  result = canon_query(data, data->state.up.query, &canonical_query);
  if(result)
    goto fail;

  result = canon_string(data->state.up.path, strlen(data->state.up.path),
                        &canonical_path, NULL);
  if(result)
    goto fail;
  result = CURLE_OUT_OF_MEMORY;

  canonical_request =
    aprintf("%s\n" /* HTTPRequestMethod */
            "%s\n" /* CanonicalURI */
            "%s\n" /* CanonicalQueryString */
            "%s\n" /* CanonicalHeaders */
            "%s\n" /* SignedHeaders */
            "%.*s",  /* HashedRequestPayload in hex */
            method,
            Curl_dyn_ptr(&canonical_path),
            Curl_dyn_ptr(&canonical_query) ?
            Curl_dyn_ptr(&canonical_query) : "",
            Curl_dyn_ptr(&canonical_headers),
            Curl_dyn_ptr(&signed_headers),
            (int)payload_hash_len, payload_hash);
  if(!canonical_request)
    goto fail;

  DEBUGF(infof(data, "Canonical request: %s", canonical_request));

  /* provider 0 lowercase */
  Curl_strntolower(provider0, provider0, strlen(provider0));
  request_type = aprintf("%s4_request", provider0);
  if(!request_type)
    goto fail;

  credential_scope = aprintf("%s/%s/%s/%s",
                             date, region, service, request_type);
  if(!credential_scope)
    goto fail;

  if(Curl_sha256it(sha_hash, (unsigned char *) canonical_request,
                   strlen(canonical_request)))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash);

  /* provider 0 uppercase */
  Curl_strntoupper(provider0, provider0, strlen(provider0));

  /*
   * Google allows using RSA key instead of HMAC, so this code might change
   * in the future. For now we only support HMAC.
   */
  str_to_sign = aprintf("%s4-HMAC-SHA256\n" /* Algorithm */
                        "%s\n" /* RequestDateTime */
                        "%s\n" /* CredentialScope */
                        "%s",  /* HashedCanonicalRequest in hex */
                        provider0,
                        timestamp,
                        credential_scope,
                        sha_hex);
  if(!str_to_sign) {
    goto fail;
  }

  /* provider 0 uppercase */
  secret = aprintf("%s4%s", provider0,
                   data->state.aptr.passwd ?
                   data->state.aptr.passwd : "");
  if(!secret)
    goto fail;

  HMAC_SHA256(secret, strlen(secret), date, strlen(date), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), region, strlen(region), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), service, strlen(service), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), request_type, strlen(request_type), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), str_to_sign, strlen(str_to_sign), sign0);

  sha256_to_hex(sha_hex, sign0);

  /* provider 0 uppercase */
  auth_headers = aprintf("Authorization: %s4-HMAC-SHA256 "
                         "Credential=%s/%s, "
                         "SignedHeaders=%s, "
                         "Signature=%s\r\n"
                         /*
                          * date_header is added here, only if it was not
                          * user-specified (using CURLOPT_HTTPHEADER).
                          * date_header includes \r\n
                          */
                         "%s"
                         "%s", /* optional sha256 header includes \r\n */
                         provider0,
                         user,
                         credential_scope,
                         Curl_dyn_ptr(&signed_headers),
                         sha_hex,
                         date_header ? date_header : "",
                         content_sha256_hdr);
  if(!auth_headers) {
    goto fail;
  }

  Curl_safefree(data->state.aptr.userpwd);
  data->state.aptr.userpwd = auth_headers;
  data->state.authhost.done = TRUE;
  result = CURLE_OK;

fail:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_path);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  free(canonical_request);
  free(request_type);
  free(credential_scope);
  free(str_to_sign);
  free(secret);
  free(date_header);
  return result;
}